

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recognition.cpp
# Opt level: O1

int __thiscall
TUPU::Recognition::performWithPath
          (Recognition *this,string *secretId,string *result,long *statusCode,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *images,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *tags,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sequenceIds)

{
  pointer pbVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  pointer __s;
  ulong uVar8;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> imgList;
  value_type local_b8;
  char *local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> local_78;
  Recognition *local_58;
  string *local_50;
  string *local_48;
  long *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_78.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = images;
  local_58 = this;
  local_50 = secretId;
  local_48 = result;
  local_40 = statusCode;
  local_38 = tags;
  if ((images->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (images->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_a8 = (char *)0x0;
    __s = (char *)0x0;
    uVar7 = 0;
    uVar8 = 1;
    do {
      local_b8.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TImage *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<TUPU::TImage,std::allocator<TUPU::TImage>>
                (&local_b8.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (TImage **)&local_b8,(allocator<TUPU::TImage> *)local_a0);
      TImage::setPath(local_b8.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (local_80->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar7);
      peVar3 = local_b8.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pbVar1 = (local_38->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((uVar7 < (ulong)((long)(local_38->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5))
         && (pbVar1[uVar7]._M_string_length != 0)) {
        __s = pbVar1[uVar7]._M_dataplus._M_p;
      }
      if (__s != (char *)0x0) {
        local_a0[0] = local_90;
        sVar6 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,__s,__s + sVar6);
        std::__cxx11::string::_M_assign((string *)&peVar3->m_tag);
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0]);
        }
      }
      peVar3 = local_b8.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pbVar1 = (sequenceIds->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((uVar7 < (ulong)((long)(sequenceIds->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5))
         && (pbVar1[uVar7]._M_string_length != 0)) {
        local_a8 = pbVar1[uVar7]._M_dataplus._M_p;
      }
      pcVar4 = local_a8;
      if (local_a8 != (char *)0x0) {
        local_a0[0] = local_90;
        sVar6 = strlen(local_a8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,pcVar4,pcVar4 + sVar6);
        std::__cxx11::string::_M_assign((string *)&peVar3->m_sequenceId);
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0]);
        }
      }
      std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
      push_back(&local_78,&local_b8);
      if (local_b8.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      bVar2 = uVar8 < (ulong)((long)(local_80->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_80->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar2);
  }
  iVar5 = perform(local_58,local_50,&local_78,local_48,local_40);
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  ~vector(&local_78);
  return iVar5;
}

Assistant:

int Recognition::performWithPath(const string & secretId, string & result, long *statusCode,
    const vector<string> & images, const vector<string> & tags,
    const std::vector<std::string> & sequenceIds)
{
    vector<shared_ptr<TImage>> imgList;

    unsigned int i = 0;
    const char * tag = NULL;
    const char * sequenceId = NULL;
    while (i < images.size())
    {
        shared_ptr<TImage> image = std::make_shared<TImage>();
        image->setPath(images[i]);

        if (i < tags.size() && !tags[i].empty())
            tag = tags[i].c_str();
        if (tag)
            image->setTag(tag);

        if (i < sequenceIds.size() && !sequenceIds[i].empty())
            sequenceId = sequenceIds[i].c_str();
        if (sequenceId)
            image->setSequenceId(sequenceId);

        imgList.push_back(image);

        i++;
    }

    return perform(secretId, imgList, result, statusCode);
}